

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

JObject * __thiscall
pstack::JObject::field<char[22],unsigned_int,char>(JObject *this,char (*k) [22],uint *v,char *c)

{
  ostream *os;
  char (*local_40) [22];
  Field<char[22],_unsigned_int> field;
  
  local_40 = k;
  field.k = (char (*) [22])v;
  os = std::operator<<(this->os,this->sep);
  field.v = (uint *)&local_40;
  pstack::operator<<(os,(JSON<pstack::Field<char[22],_unsigned_int>,_char> *)&field.v);
  this->sep = ", ";
  return this;
}

Assistant:

JObject &field(const K &k, const V&v, const C &c = C()) {
         Field<K,V> field(k, v);
         os << sep << json(field, c);
         sep = ", ";
         return *this;
      }